

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::TimestampTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TimestampTestInstance *this)

{
  VkSemaphore *pVVar1;
  VkResult VVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  Handle<(vk::HandleType)6> *pHVar5;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  const_reference pvVar6;
  size_type sVar7;
  Handle<(vk::HandleType)11> *pHVar8;
  uint local_ec;
  deUint32 ndx;
  deUint32 stageSize;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> queueProperties;
  deUint64 timestampMask;
  undefined4 local_78 [2];
  VkSubmitInfo submitInfo;
  VkQueue queue;
  VkDevice vkDevice;
  DeviceInterface *vk;
  TimestampTestInstance *this_local;
  
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar4 = Context::getDevice((this->super_TestInstance).m_context);
  submitInfo.pSignalSemaphores =
       (VkSemaphore *)Context::getUniversalQueue((this->super_TestInstance).m_context);
  (*(this->super_TestInstance)._vptr_TestInstance[4])();
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  VVar2 = (*pDVar3->_vptr_DeviceInterface[0x14])(pDVar3,pVVar4,1,pHVar5);
  ::vk::checkResult(VVar2,"vk.resetFences(vkDevice, 1u, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x301);
  memset(local_78,0,0x48);
  local_78[0] = 4;
  submitInfo.pWaitDstStageMask._0_4_ = 1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = submitInfo.pSignalSemaphores;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  VVar2 = (*pDVar3->_vptr_DeviceInterface[2])(pDVar3,pVVar1,1,local_78,pHVar5->m_internal);
  ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1u, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x30f);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  VVar2 = (*pDVar3->_vptr_DeviceInterface[0x16])(pDVar3,pVVar4,1,pHVar5,1,0xffffffffffffffff);
  ::vk::checkResult(VVar2,"vk.waitForFences(vkDevice, 1u, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x311);
  vk_00 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceQueueFamilyProperties
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             local_a0,vk_00,physicalDevice);
  pvVar6 = std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
           operator[]((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                       *)local_a0,0);
  if (pvVar6->timestampValidBits == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"Device does not support timestamp!",&local_c1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
  }
  else {
    pvVar6 = std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
             ::operator[]((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                           *)local_a0,0);
    if (pvVar6->timestampValidBits == 0x40) {
      queueProperties.
      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xffffffffffffffff;
    }
    else {
      pvVar6 = std::
               vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
               operator[]((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                           *)local_a0,0);
      queueProperties.
      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((1L << ((byte)pvVar6->timestampValidBits & 0x3f)) + -1);
    }
    sVar7 = std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::
            size(&this->m_stages);
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                       (&(this->m_queryPool).super_RefBase<vk::Handle<(vk::HandleType)11>_>);
    (*pDVar3->_vptr_DeviceInterface[0x20])
              (pDVar3,pVVar4,pHVar8->m_internal,0,sVar7 & 0xffffffff,(sVar7 & 0xffffffff) << 3,
               this->m_timestampValues,8,3);
    for (local_ec = 0; local_ec < (uint)sVar7; local_ec = local_ec + 1) {
      this->m_timestampValues[local_ec] =
           (ulong)queueProperties.
                  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage &
           this->m_timestampValues[local_ec];
    }
    (*(this->super_TestInstance)._vptr_TestInstance[3])(__return_storage_ptr__);
  }
  std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::~vector
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             local_a0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TimestampTestInstance::iterate(void)
{
	const DeviceInterface&      vk          = m_context.getDeviceInterface();
	const VkDevice              vkDevice    = m_context.getDevice();
	const VkQueue               queue       = m_context.getUniversalQueue();

	configCommandBuffer();

	VK_CHECK(vk.resetFences(vkDevice, 1u, &m_fence.get()));

	const VkSubmitInfo          submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,                      // VkStructureType         sType;
		DE_NULL,                                            // const void*             pNext;
		0u,                                                 // deUint32                waitSemaphoreCount;
		DE_NULL,                                            // const VkSemaphore*      pWaitSemaphores;
		(const VkPipelineStageFlags*)DE_NULL,
		1u,                                                 // deUint32                commandBufferCount;
		&m_cmdBuffer.get(),                                 // const VkCommandBuffer*  pCommandBuffers;
		0u,                                                 // deUint32                signalSemaphoreCount;
		DE_NULL,                                            // const VkSemaphore*      pSignalSemaphores;
	};
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *m_fence));

	VK_CHECK(vk.waitForFences(vkDevice, 1u, &m_fence.get(), true, ~(0ull) /* infinity*/));

	// Generate the timestamp mask
	deUint64                    timestampMask;
	const std::vector<VkQueueFamilyProperties>   queueProperties = vk::getPhysicalDeviceQueueFamilyProperties(m_context.getInstanceInterface(), m_context.getPhysicalDevice());
	if(queueProperties[0].timestampValidBits == 0)
	{
		return tcu::TestStatus::fail("Device does not support timestamp!");
	}
	else if(queueProperties[0].timestampValidBits == 64)
	{
		timestampMask = 0xFFFFFFFFFFFFFFFF;
	}
	else
	{
		timestampMask = ((deUint64)1 << queueProperties[0].timestampValidBits) - 1;
	}

	// Get timestamp value from query pool
	deUint32                    stageSize = (deUint32)m_stages.size();

	vk.getQueryPoolResults(vkDevice, *m_queryPool, 0u, stageSize, sizeof(deUint64) * stageSize, (void*)m_timestampValues, sizeof(deUint64), VK_QUERY_RESULT_64_BIT | VK_QUERY_RESULT_WAIT_BIT);

	for (deUint32 ndx = 0; ndx < stageSize; ndx++)
	{
		m_timestampValues[ndx] &= timestampMask;
	}

	return verifyTimestamp();
}